

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QCss::AttributeSelector>::emplace<QCss::AttributeSelector_const&>
          (QMovableArrayOps<QCss::AttributeSelector> *this,qsizetype i,AttributeSelector *args)

{
  AttributeSelector **ppAVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_90;
  AttributeSelector tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QCss::AttributeSelector>).
           super_QArrayDataPointer<QCss::AttributeSelector>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QCss::AttributeSelector>).
        super_QArrayDataPointer<QCss::AttributeSelector>.size == i) {
      qVar5 = QArrayDataPointer<QCss::AttributeSelector>::freeSpaceAtEnd
                        ((QArrayDataPointer<QCss::AttributeSelector> *)this);
      if (qVar5 == 0) goto LAB_00550323;
      QCss::AttributeSelector::AttributeSelector
                ((this->super_QGenericArrayOps<QCss::AttributeSelector>).
                 super_QArrayDataPointer<QCss::AttributeSelector>.ptr +
                 (this->super_QGenericArrayOps<QCss::AttributeSelector>).
                 super_QArrayDataPointer<QCss::AttributeSelector>.size,args);
LAB_00550420:
      pqVar2 = &(this->super_QGenericArrayOps<QCss::AttributeSelector>).
                super_QArrayDataPointer<QCss::AttributeSelector>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_005503df;
    }
LAB_00550323:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QCss::AttributeSelector>::freeSpaceAtBegin
                        ((QArrayDataPointer<QCss::AttributeSelector> *)this);
      if (qVar5 != 0) {
        QCss::AttributeSelector::AttributeSelector
                  ((this->super_QGenericArrayOps<QCss::AttributeSelector>).
                   super_QArrayDataPointer<QCss::AttributeSelector>.ptr + -1,args);
        ppAVar1 = &(this->super_QGenericArrayOps<QCss::AttributeSelector>).
                   super_QArrayDataPointer<QCss::AttributeSelector>.ptr;
        *ppAVar1 = *ppAVar1 + -1;
        goto LAB_00550420;
      }
    }
  }
  tmp._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.value.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.value.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.value.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.name.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QCss::AttributeSelector::AttributeSelector(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QCss::AttributeSelector>).
          super_QArrayDataPointer<QCss::AttributeSelector>.size != 0;
  QArrayDataPointer<QCss::AttributeSelector>::detachAndGrow
            ((QArrayDataPointer<QCss::AttributeSelector> *)this,(uint)(i == 0 && bVar6),1,
             (AttributeSelector **)0x0,(QArrayDataPointer<QCss::AttributeSelector> *)0x0);
  if (i == 0 && bVar6) {
    QCss::AttributeSelector::AttributeSelector
              ((this->super_QGenericArrayOps<QCss::AttributeSelector>).
               super_QArrayDataPointer<QCss::AttributeSelector>.ptr + -1,&tmp);
    ppAVar1 = &(this->super_QGenericArrayOps<QCss::AttributeSelector>).
               super_QArrayDataPointer<QCss::AttributeSelector>.ptr;
    *ppAVar1 = *ppAVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QCss::AttributeSelector>).
              super_QArrayDataPointer<QCss::AttributeSelector>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_90,(QArrayDataPointer<QCss::AttributeSelector> *)this,i,1);
    QCss::AttributeSelector::AttributeSelector(local_90.displaceFrom,&tmp);
    local_90.displaceFrom = local_90.displaceFrom + 1;
    (local_90.data)->size = (local_90.data)->size + local_90.nInserts;
  }
  QCss::AttributeSelector::~AttributeSelector(&tmp);
LAB_005503df:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }